

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

int av1_apply_selfguided_restoration_c
              (uint8_t *dat8,int width,int height,int stride,int eps,int *xqd,uint8_t *dst8,
              int dst_stride,int32_t *tmpbuf,int bit_depth,int highbd)

{
  int iVar1;
  int iVar2;
  undefined2 *puVar3;
  int iVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ushort *puVar10;
  ulong local_88;
  uint8_t *local_80;
  undefined2 *local_78;
  ushort *local_70;
  
  av1_selfguided_restoration_c
            (dat8,width,height,stride,tmpbuf,tmpbuf + 0x27734,width,eps,bit_depth,highbd);
  iVar1 = av1_sgr_params[eps].r[0];
  if (iVar1 == 0) {
    iVar7 = 0x80 - xqd[1];
    iVar4 = 0;
  }
  else {
    iVar4 = *xqd;
    if (av1_sgr_params[eps].r[1] == 0) {
      iVar7 = 0;
    }
    else {
      iVar7 = 0x80 - (xqd[1] + iVar4);
    }
  }
  if (0 < height) {
    local_70 = (ushort *)((long)dat8 * 2);
    local_78 = (undefined2 *)((long)dst8 * 2);
    local_88 = 0;
    uVar9 = 0;
    local_80 = dat8;
    do {
      if (0 < width) {
        iVar2 = av1_sgr_params[eps].r[1];
        uVar8 = 0;
        puVar3 = local_78;
        puVar10 = local_70;
        do {
          if (highbd == 0) {
            uVar5 = (ushort)local_80[uVar8];
          }
          else {
            uVar5 = *puVar10;
          }
          iVar6 = (uint)uVar5 * 0x800;
          if (0 < iVar1) {
            iVar6 = iVar6 + (tmpbuf[local_88 + uVar8] + (uint)uVar5 * -0x10) * iVar4;
          }
          if (0 < iVar2) {
            iVar6 = iVar6 + (tmpbuf[local_88 + uVar8 + 0x27734] + (uint)uVar5 * -0x10) * iVar7;
          }
          iVar6 = iVar6 * 0x20 + 0x8000 >> 0x10;
          if (bit_depth == 10) {
            if (0x3fe < iVar6) {
              iVar6 = 0x3ff;
            }
          }
          else if (bit_depth == 0xc) {
            if (0xffe < iVar6) {
              iVar6 = 0xfff;
            }
          }
          else if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (highbd == 0) {
            dst8[uVar8] = (uint8_t)iVar6;
          }
          else {
            *puVar3 = (short)iVar6;
          }
          uVar8 = uVar8 + 1;
          puVar10 = puVar10 + 1;
          puVar3 = puVar3 + 1;
        } while ((uint)width != uVar8);
      }
      uVar9 = uVar9 + 1;
      local_88 = (ulong)(uint)((int)local_88 + width);
      local_70 = local_70 + stride;
      local_80 = local_80 + stride;
      local_78 = local_78 + dst_stride;
      dst8 = dst8 + dst_stride;
    } while (uVar9 != (uint)height);
  }
  return 0;
}

Assistant:

int av1_apply_selfguided_restoration_c(const uint8_t *dat8, int width,
                                       int height, int stride, int eps,
                                       const int *xqd, uint8_t *dst8,
                                       int dst_stride, int32_t *tmpbuf,
                                       int bit_depth, int highbd) {
  int32_t *flt0 = tmpbuf;
  int32_t *flt1 = flt0 + RESTORATION_UNITPELS_MAX;
  assert(width * height <= RESTORATION_UNITPELS_MAX);

  const int ret = av1_selfguided_restoration_c(
      dat8, width, height, stride, flt0, flt1, width, eps, bit_depth, highbd);
  if (ret != 0) return ret;
  const sgr_params_type *const params = &av1_sgr_params[eps];
  int xq[2];
  av1_decode_xq(xqd, xq, params);
  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; ++j) {
      const int k = i * width + j;
      uint8_t *dst8ij = dst8 + i * dst_stride + j;
      const uint8_t *dat8ij = dat8 + i * stride + j;

      const uint16_t pre_u = highbd ? *CONVERT_TO_SHORTPTR(dat8ij) : *dat8ij;
      const int32_t u = (int32_t)pre_u << SGRPROJ_RST_BITS;
      int32_t v = u << SGRPROJ_PRJ_BITS;
      // If params->r == 0 then we skipped the filtering in
      // av1_selfguided_restoration_c, i.e. flt[k] == u
      if (params->r[0] > 0) v += xq[0] * (flt0[k] - u);
      if (params->r[1] > 0) v += xq[1] * (flt1[k] - u);
      const int16_t w =
          (int16_t)ROUND_POWER_OF_TWO(v, SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);

      const uint16_t out = clip_pixel_highbd(w, bit_depth);
      if (highbd)
        *CONVERT_TO_SHORTPTR(dst8ij) = out;
      else
        *dst8ij = (uint8_t)out;
    }
  }
  return 0;
}